

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_check_ext_instance
              (lys_module *module,lys_ext_instance ***ext,uint size,void *parent,unres_schema *unres
              )

{
  lys_ext_instance **pplVar1;
  lys_ext_instance *plVar2;
  int iVar3;
  lys_node *snode;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (size == uVar4) {
      return 0;
    }
    snode = (lys_node *)malloc(0x30);
    pplVar1 = *ext;
    snode->name = (char *)pplVar1[uVar4]->parent;
    *(undefined4 *)&snode->dsc = 1;
    snode->ref = (char *)parent;
    *(lys_module **)&snode->flags = module;
    plVar2 = pplVar1[uVar4];
    *(uint *)&snode->ext = (uint)plVar2->parent_type;
    *(uint *)((long)&snode->ext + 4) = (uint)plVar2->insubstmt;
    *(uint8_t *)&snode->iffeature = plVar2->insubstmt_index;
    *(char *)((long)&snode->iffeature + 1) = (char)uVar4;
    iVar3 = unres_schema_add_node(module,unres,ext,UNRES_EXT,snode);
    uVar4 = uVar4 + 1;
  } while (iVar3 != -1);
  return 1;
}

Assistant:

int
yang_check_ext_instance(struct lys_module *module, struct lys_ext_instance ***ext, uint size,
                        void *parent, struct unres_schema *unres)
{
    struct unres_ext *info;
    uint i;

    for (i = 0; i < size; ++i) {
        info = malloc(sizeof *info);
        info->data.yang = (*ext)[i]->parent;
        info->datatype = LYS_IN_YANG;
        info->parent = parent;
        info->mod = module;
        info->parent_type = (*ext)[i]->parent_type;
        info->substmt = (*ext)[i]->insubstmt;
        info->substmt_index = (*ext)[i]->insubstmt_index;
        info->ext_index = i;
        if (unres_schema_add_node(module, unres, ext, UNRES_EXT, (struct lys_node *)info) == -1) {
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}